

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwDestroyWindow(GLFWwindow *handle)

{
  GLFWwindow *pGVar1;
  _GLFWwindow *local_20;
  _GLFWwindow **prev;
  _GLFWwindow *window;
  GLFWwindow *handle_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (handle != (GLFWwindow *)0x0) {
    memset(handle + 0x2c0,0,0x88);
    pGVar1 = (GLFWwindow *)_glfwPlatformGetTls(&_glfw.contextSlot);
    if (handle == pGVar1) {
      glfwMakeContextCurrent((GLFWwindow *)0x0);
    }
    _glfwPlatformDestroyWindow((_GLFWwindow *)handle);
    for (local_20 = (_GLFWwindow *)&_glfw.windowListHead; local_20->next != (_GLFWwindow *)handle;
        local_20 = local_20->next) {
    }
    local_20->next = *(_GLFWwindow **)handle;
    free(handle);
  }
  return;
}

Assistant:

GLFWAPI void glfwDestroyWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    // Allow closing of NULL (to match the behavior of free)
    if (window == NULL)
        return;

    // Clear all callbacks to avoid exposing a half torn-down window object
    memset(&window->callbacks, 0, sizeof(window->callbacks));

    // The window's context must not be current on another thread when the
    // window is destroyed
    if (window == _glfwPlatformGetTls(&_glfw.contextSlot))
        glfwMakeContextCurrent(NULL);

    _glfwPlatformDestroyWindow(window);

    // Unlink window from global linked list
    {
        _GLFWwindow** prev = &_glfw.windowListHead;

        while (*prev != window)
            prev = &((*prev)->next);

        *prev = window->next;
    }

    free(window);
}